

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void get_ss_esp_from_tss(CPUX86State *env,uint32_t *ss_ptr,uint32_t *esp_ptr,int dpl,
                        uintptr_t retaddr)

{
  target_ulong tVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  ArchCPU *cpu_00;
  sbyte sVar6;
  int shift;
  int index;
  int type;
  X86CPU *cpu;
  uintptr_t retaddr_local;
  int dpl_local;
  uint32_t *esp_ptr_local;
  uint32_t *ss_ptr_local;
  CPUX86State *env_local;
  
  cpu_00 = env_archcpu(env);
  if (((env->tr).flags & 0x8000) == 0) {
    cpu_abort_x86_64(&cpu_00->parent_obj,"invalid tss");
  }
  uVar2 = (env->tr).flags >> 8;
  if ((uVar2 & 7) != 1) {
    cpu_abort_x86_64(&cpu_00->parent_obj,"invalid tss type");
  }
  iVar3 = (int)(uVar2 & 0xf) >> 3;
  sVar6 = (sbyte)iVar3;
  iVar4 = dpl * 4 + 2 << sVar6;
  if ((env->tr).limit < (iVar4 + (4 << sVar6)) - 1U) {
    raise_exception_err_ra_x86_64(env,10,(env->tr).selector & 0xfffc,retaddr);
  }
  if (iVar3 == 0) {
    tVar1 = (env->tr).base;
    iVar3 = cpu_mmu_index_kernel(env);
    uVar5 = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + (long)iVar4,iVar3,retaddr);
    *esp_ptr = uVar5;
    tVar1 = (env->tr).base;
    iVar3 = cpu_mmu_index_kernel(env);
    uVar5 = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + (long)iVar4 + 2,iVar3,retaddr);
    *ss_ptr = uVar5;
  }
  else {
    tVar1 = (env->tr).base;
    iVar3 = cpu_mmu_index_kernel(env);
    uVar5 = cpu_ldl_mmuidx_ra_x86_64(env,tVar1 + (long)iVar4,iVar3,retaddr);
    *esp_ptr = uVar5;
    tVar1 = (env->tr).base;
    iVar3 = cpu_mmu_index_kernel(env);
    uVar5 = cpu_lduw_mmuidx_ra_x86_64(env,tVar1 + (long)iVar4 + 4,iVar3,retaddr);
    *ss_ptr = uVar5;
  }
  return;
}

Assistant:

static inline void get_ss_esp_from_tss(CPUX86State *env, uint32_t *ss_ptr,
                                       uint32_t *esp_ptr, int dpl,
                                       uintptr_t retaddr)
{
    X86CPU *cpu = env_archcpu(env);
    int type, index, shift;

#if 0
    {
        int i;
        printf("TR: base=%p limit=%x\n", env->tr.base, env->tr.limit);
        for (i = 0; i < env->tr.limit; i++) {
            printf("%02x ", env->tr.base[i]);
            if ((i & 7) == 7) {
                printf("\n");
            }
        }
        printf("\n");
    }
#endif

    if (!(env->tr.flags & DESC_P_MASK)) {
        cpu_abort(CPU(cpu), "invalid tss");
    }
    type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if ((type & 7) != 1) {
        cpu_abort(CPU(cpu), "invalid tss type");
    }
    shift = type >> 3;
    index = (dpl * 4 + 2) << shift;
    if (index + (4 << shift) - 1 > env->tr.limit) {
        raise_exception_err_ra(env, EXCP0A_TSS, env->tr.selector & 0xfffc, retaddr);
    }
    if (shift == 0) {
        *esp_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index, retaddr);
        *ss_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index + 2, retaddr);
    } else {
        *esp_ptr = cpu_ldl_kernel_ra(env, env->tr.base + index, retaddr);
        *ss_ptr = cpu_lduw_kernel_ra(env, env->tr.base + index + 4, retaddr);
    }
}